

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::boxMesh(Mesh *__return_storage_ptr__,float _width,float _height,float _depth,int _resX,
                    int _resY,int _resZ)

{
  ulong uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar9;
  float fVar10;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  vec2 texcoord;
  vec3 vert;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_16c;
  float local_168;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_164;
  float local_160;
  float local_15c;
  ulong local_158;
  float local_14c;
  ulong local_148;
  ulong local_140;
  vec3 local_138;
  long local_128;
  ulong local_120;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  ulong local_108;
  uint uStack_100;
  uint uStack_fc;
  long local_f8;
  ulong local_f0;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  ulong local_d8;
  ulong local_d0;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  ulong local_b8;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_a8 = _height;
  local_98 = _depth;
  uStack_94 = in_XMM2_Db;
  uStack_90 = in_XMM2_Dc;
  uStack_8c = in_XMM2_Dd;
  local_48 = _width;
  uStack_44 = in_XMM0_Db;
  uStack_40 = in_XMM0_Dc;
  uStack_3c = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = TRIANGLES;
  local_7c = _resZ + 1;
  local_108 = 0;
  local_148 = (ulong)(_resX + 1);
  if (_resX < 1) {
    local_148 = 0;
  }
  local_120 = 0;
  if (0 < _resZ) {
    local_120 = (ulong)local_7c;
  }
  local_c8 = local_48 * 0.5;
  uStack_c4 = uStack_44;
  uStack_c0 = uStack_40;
  uStack_bc = uStack_3c;
  local_78 = ZEXT416((uint)(local_a8 * 0.5));
  local_68 = ZEXT416((uint)(local_98 * 0.5));
  local_14c = (float)(int)local_148;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  fVar8 = (float)(int)(_resY + 1U);
  local_128 = CONCAT44(local_128._4_4_,fVar8);
  local_138.field_2.z = 1.0;
  local_d8 = 0;
  local_140 = (ulong)(uint)_resY;
  local_f0 = (ulong)(uint)_resZ;
  local_d0 = (ulong)(uint)_resX;
  if (0 < _resY) {
    local_d8 = (ulong)(_resY + 1U);
    local_158 = CONCAT44(local_158._4_4_,local_14c + -1.0);
    local_e8 = -local_c8;
    uStack_e4 = uStack_44 ^ 0x80000000;
    uStack_e0 = uStack_40 ^ 0x80000000;
    uStack_dc = uStack_3c ^ 0x80000000;
    uStack_110 = 0x80000000;
    uStack_10c = 0x80000000;
    local_118 = CONCAT44(0x80000000,-(local_a8 * 0.5));
    uVar1 = 1;
    if (1 < (int)local_148) {
      uVar1 = local_148;
    }
    do {
      if (0 < (int)local_d0) {
        fVar9 = 1.0 - (float)local_108._0_4_ / (fVar8 + -1.0);
        fVar10 = (float)local_118 - (fVar9 + -1.0) * local_a8;
        iVar7 = 0;
        do {
          local_16c.x = (float)iVar7 / (float)local_158;
          local_164.x = local_16c.x * local_48 + local_e8;
          local_15c = (float)local_68._0_4_;
          local_168 = fVar9;
          local_160 = fVar10;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar7 = iVar7 + 1;
        } while ((int)uVar1 != iVar7);
      }
      iVar7 = (int)local_108;
      local_108 = (ulong)(iVar7 + 1);
    } while (iVar7 != (int)local_140);
  }
  iVar2 = (int)local_d8 + -1;
  iVar7 = (int)local_120;
  if (1 < (int)local_d8) {
    iVar5 = (int)local_148;
    iVar6 = 0;
    uVar1 = local_120;
    do {
      iVar7 = (int)local_148;
      if (1 < iVar7) {
        uVar3 = iVar6 * iVar7;
        uVar4 = (iVar6 + 1) * iVar7;
        iVar7 = iVar5 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          iVar7 = iVar7 + -1;
          uVar1 = local_120;
          uVar4 = uVar4 + 1;
        } while (iVar7 != 0);
      }
      iVar6 = iVar6 + 1;
      iVar7 = (int)uVar1;
    } while (iVar6 != iVar2);
  }
  local_f8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_138.field_2.z = 0.0;
  local_158 = CONCAT44(local_158._4_4_,(float)iVar7);
  if (0 < (int)local_140) {
    local_e8 = (float)iVar7 + -1.0;
    local_58 = (float)local_128 + -1.0;
    uStack_b0 = local_78._8_4_ ^ 0x80000000;
    uStack_ac = local_78._12_4_ ^ 0x80000000;
    local_b8 = local_78._0_8_ ^ 0x8000000080000000;
    uStack_100 = uStack_90 ^ 0x80000000;
    uStack_fc = uStack_8c ^ 0x80000000;
    local_108 = CONCAT44(uStack_94,local_98) ^ 0x8000000080000000;
    iVar7 = 1;
    if (1 < (int)local_120) {
      iVar7 = (int)local_120;
    }
    local_118 = 0;
    do {
      if (0 < (int)local_f0) {
        fVar8 = 1.0 - (float)(int)(float)local_118 / local_58;
        fVar9 = (float)local_b8 - (fVar8 + -1.0) * local_a8;
        iVar5 = 0;
        do {
          local_16c.x = (float)iVar5 / local_e8;
          local_164.x = local_c8;
          local_15c = local_16c.x * local_108._0_4_ + (float)local_68._0_4_;
          local_168 = fVar8;
          local_160 = fVar9;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar5 = iVar5 + 1;
        } while (iVar7 != iVar5);
      }
      iVar5 = (int)local_118;
      local_118 = (ulong)(iVar5 + 1);
    } while (iVar5 != (int)local_140);
  }
  if (1 < (int)local_d8) {
    local_f8 = (local_f8 >> 2) * -0x5555555555555555;
    iVar7 = (int)local_120;
    iVar5 = 0;
    uVar1 = local_120;
    do {
      iVar6 = (int)uVar1;
      if (1 < iVar6) {
        uVar3 = iVar5 * iVar6 + (int)local_f8;
        uVar4 = (iVar5 + 1) * iVar6 + (int)local_f8;
        iVar6 = iVar7 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          iVar6 = iVar6 + -1;
          uVar1 = local_120;
          uVar4 = uVar4 + 1;
        } while (iVar6 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar2);
  }
  local_f8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_138.field_2.z = 0.0;
  if (0 < (int)local_140) {
    local_158 = CONCAT44(local_158._4_4_,(float)local_158 + -1.0);
    local_58 = (float)local_128 + -1.0;
    uStack_100 = uStack_c0 ^ 0x80000000;
    uStack_fc = uStack_bc ^ 0x80000000;
    local_108 = CONCAT44(uStack_c4,local_c8) ^ 0x8000000080000000;
    uStack_b0 = local_78._8_4_ ^ 0x80000000;
    uStack_ac = local_78._12_4_ ^ 0x80000000;
    local_b8 = local_78._0_8_ ^ 0x8000000080000000;
    local_e8 = -(float)local_68._0_4_;
    uStack_e4 = local_68._4_4_ ^ 0x80000000;
    uStack_e0 = local_68._8_4_ ^ 0x80000000;
    uStack_dc = local_68._12_4_ ^ 0x80000000;
    iVar7 = 1;
    if (1 < (int)local_120) {
      iVar7 = (int)local_120;
    }
    local_118 = 0;
    do {
      if (0 < (int)local_f0) {
        fVar8 = 1.0 - (float)(int)(float)local_118 / local_58;
        fVar9 = (float)local_b8 - (fVar8 + -1.0) * local_a8;
        iVar5 = 0;
        do {
          local_16c.x = (float)iVar5 / (float)local_158;
          local_164 = local_108._0_4_;
          local_15c = local_16c.x * local_98 + local_e8;
          local_168 = fVar8;
          local_160 = fVar9;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar5 = iVar5 + 1;
        } while (iVar7 != iVar5);
      }
      iVar5 = (int)local_118;
      local_118 = (ulong)(iVar5 + 1);
    } while (iVar5 != (int)local_140);
  }
  if (1 < (int)local_d8) {
    local_f8 = (local_f8 >> 2) * -0x5555555555555555;
    iVar7 = (int)local_120;
    iVar5 = 0;
    uVar1 = local_120;
    do {
      iVar6 = (int)uVar1;
      if (1 < iVar6) {
        uVar3 = iVar5 * iVar6 + (int)local_f8;
        uVar4 = (iVar5 + 1) * iVar6 + (int)local_f8;
        iVar6 = iVar7 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          iVar6 = iVar6 + -1;
          uVar1 = local_120;
          uVar4 = uVar4 + 1;
        } while (iVar6 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar2);
  }
  local_b8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_138.field_2.z = -1.0;
  if (0 < (int)local_140) {
    local_158 = CONCAT44(local_158._4_4_,local_14c + -1.0);
    local_128 = CONCAT44(local_128._4_4_,(float)local_128 + -1.0);
    uStack_100 = uStack_40 ^ 0x80000000;
    uStack_fc = uStack_3c ^ 0x80000000;
    local_108 = CONCAT44(uStack_44,local_48) ^ 0x8000000080000000;
    local_58 = -(float)local_78._0_4_;
    uStack_54 = local_78._4_4_ ^ 0x80000000;
    uStack_50 = local_78._8_4_ ^ 0x80000000;
    uStack_4c = local_78._12_4_ ^ 0x80000000;
    local_e8 = -(float)local_68._0_4_;
    uStack_e4 = local_68._4_4_ ^ 0x80000000;
    uStack_e0 = local_68._8_4_ ^ 0x80000000;
    uStack_dc = local_68._12_4_ ^ 0x80000000;
    iVar7 = 1;
    if (1 < (int)local_148) {
      iVar7 = (int)local_148;
    }
    local_118 = 0;
    do {
      if (0 < (int)local_d0) {
        fVar8 = 1.0 - (float)(int)(float)local_118 / (float)local_128;
        fVar9 = local_58 - (fVar8 + -1.0) * local_a8;
        iVar5 = 0;
        do {
          local_16c.x = (float)iVar5 / (float)local_158;
          local_164.x = local_16c.x * local_108._0_4_ + local_c8;
          local_15c = local_e8;
          local_168 = fVar8;
          local_160 = fVar9;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar5 = iVar5 + 1;
        } while (iVar7 != iVar5);
      }
      iVar5 = (int)local_118;
      local_118 = (ulong)(iVar5 + 1);
    } while (iVar5 != (int)local_140);
  }
  if (1 < (int)local_d8) {
    local_b8 = ((long)local_b8 >> 2) * -0x5555555555555555;
    iVar7 = (int)local_148;
    iVar5 = 0;
    uVar1 = local_148;
    do {
      iVar6 = (int)uVar1;
      if (1 < iVar6) {
        uVar3 = iVar5 * iVar6 + (int)local_b8;
        uVar4 = (iVar5 + 1) * iVar6 + (int)local_b8;
        iVar6 = iVar7 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          Mesh::addIndex(__return_storage_ptr__,uVar4 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          iVar6 = iVar6 + -1;
          uVar1 = local_148;
          uVar4 = uVar4 + 1;
        } while (iVar6 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar2);
  }
  local_128 = (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
  local_138.field_2.z = 0.0;
  fVar8 = (float)(int)local_7c;
  if (0 < (int)local_f0) {
    local_158 = CONCAT44(local_158._4_4_,local_14c + -1.0);
    local_118 = CONCAT44(local_118._4_4_,fVar8 + -1.0);
    local_e8 = -local_c8;
    uStack_e4 = uStack_c4 ^ 0x80000000;
    uStack_e0 = uStack_c0 ^ 0x80000000;
    uStack_dc = uStack_bc ^ 0x80000000;
    uStack_100 = local_78._8_4_ ^ 0x80000000;
    uStack_fc = local_78._12_4_ ^ 0x80000000;
    local_108 = local_78._0_8_ ^ 0x8000000080000000;
    local_a8 = -(float)local_68._0_4_;
    uStack_a4 = local_68._4_4_ ^ 0x80000000;
    uStack_a0 = local_68._8_4_ ^ 0x80000000;
    uStack_9c = local_68._12_4_ ^ 0x80000000;
    iVar7 = 1;
    if (1 < (int)local_148) {
      iVar7 = (int)local_148;
    }
    local_140 = 0;
    do {
      if (0 < (int)local_d0) {
        fVar9 = 1.0 - (float)(int)local_140 / (float)local_118;
        fVar10 = fVar9 * local_98 + local_a8;
        iVar2 = 0;
        do {
          local_16c.x = (float)iVar2 / (float)local_158;
          local_164.x = local_16c.x * local_48 + local_e8;
          local_160 = local_108._0_4_;
          local_168 = fVar9;
          local_15c = fVar10;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar2 = iVar2 + 1;
        } while (iVar7 != iVar2);
      }
      iVar2 = (int)local_140;
      local_140 = (ulong)(iVar2 + 1);
    } while (iVar2 != (int)local_f0);
  }
  local_e8 = (float)((int)local_120 + -1);
  if (1 < (int)local_120) {
    local_128 = (local_128 >> 2) * -0x5555555555555555;
    iVar7 = (int)local_148;
    iVar2 = 0;
    uVar1 = local_148;
    do {
      iVar5 = (int)uVar1;
      if (1 < iVar5) {
        uVar3 = (iVar2 + 1) * iVar5 + (int)local_128;
        uVar4 = iVar2 * iVar5 + (int)local_128;
        iVar5 = iVar7 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar4 = uVar4 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          iVar5 = iVar5 + -1;
          uVar1 = local_148;
        } while (iVar5 != 0);
      }
      iVar2 = iVar2 + 1;
    } while ((float)iVar2 != local_e8);
  }
  local_108 = (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->m_vertices).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_138.field_2.z = 0.0;
  if (0 < (int)local_f0) {
    local_14c = local_14c + -1.0;
    local_c8 = -local_c8;
    uStack_c4 = uStack_c4 ^ 0x80000000;
    uStack_c0 = uStack_c0 ^ 0x80000000;
    uStack_bc = uStack_bc ^ 0x80000000;
    local_98 = -local_98;
    uStack_94 = uStack_94 ^ 0x80000000;
    uStack_90 = uStack_90 ^ 0x80000000;
    uStack_8c = uStack_8c ^ 0x80000000;
    iVar7 = 1;
    if (1 < (int)local_148) {
      iVar7 = (int)local_148;
    }
    local_158 = 0;
    do {
      if (0 < (int)local_d0) {
        fVar9 = 1.0 - (float)(int)(float)local_158 / (fVar8 + -1.0);
        fVar10 = fVar9 * local_98 + (float)local_68._0_4_;
        iVar2 = 0;
        do {
          local_16c.x = (float)iVar2 / local_14c;
          local_164.x = local_16c.x * local_48 + local_c8;
          local_160 = (float)local_78._0_4_;
          local_168 = fVar9;
          local_15c = fVar10;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_16c);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar2 = iVar2 + 1;
        } while (iVar7 != iVar2);
      }
      iVar2 = (int)local_158;
      local_158 = (ulong)(iVar2 + 1);
    } while (iVar2 != (int)local_f0);
  }
  if (1 < (int)local_120) {
    local_108 = ((long)local_108 >> 2) * -0x5555555555555555;
    iVar7 = (int)local_148;
    iVar2 = 0;
    uVar1 = local_148;
    do {
      iVar5 = (int)uVar1;
      if (1 < iVar5) {
        uVar3 = (iVar2 + 1) * iVar5 + (int)local_108;
        uVar4 = iVar2 * iVar5 + (int)local_108;
        iVar5 = iVar7 + -1;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar4 = uVar4 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar4);
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          uVar3 = uVar3 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar3);
          iVar5 = iVar5 + -1;
          uVar1 = local_148;
        } while (iVar5 != 0);
      }
      iVar2 = iVar2 + 1;
    } while ((float)iVar2 != local_e8);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh boxMesh( float _width, float _height, float _depth, int _resX, int _resY, int _resZ ) {

    // mesh only available as triangles //
    Mesh mesh;
    mesh.setDrawMode( TRIANGLES );

    _resX = _resX + 1;
    _resY = _resY + 1;
    _resZ = _resZ + 1;

    if ( _resX < 2 ) _resX = 0;
    if ( _resY < 2 ) _resY = 0;
    if ( _resZ < 2 ) _resZ = 0;

    // halves //
    float halfW = _width * .5f;
    float halfH = _height * .5f;
    float halfD = _depth * .5f;

    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 texcoord;
    std::size_t vertOffset = 0;

    // TRIANGLES //

    // Front Face //
    normal = {0.f, 0.f, 1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Right Side Face //
    normal = {1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Left Side Face //
    normal = {-1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = -halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Back Face //
    normal = {0.f, 0.f, -1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * -_width + halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = -halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();


    // Top Face //
    normal = {0.f, -1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = -halfH;
            vert.z = texcoord.y * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Bottom Face //
    normal = {0.f, 1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = halfH;
            vert.z = texcoord.y * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }
    mesh.computeTangents();

    return mesh;
}